

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O2

XUtf8FontStruct * XCreateUtf8FontStruct(Display *dpy,char *base_font_name_list)

{
  byte bVar1;
  int iVar2;
  char cVar3;
  int iVar4;
  XUtf8FontStruct *__ptr;
  char **__ptr_00;
  ushort **ppuVar5;
  char *pcVar6;
  ulong uVar7;
  XFontStruct **ppXVar8;
  int *piVar9;
  undefined8 *puVar10;
  XFontStruct *pXVar11;
  int *piVar12;
  int iVar13;
  int j;
  char *pcVar14;
  char *pcVar15;
  byte *pbVar16;
  ulong uVar17;
  long lVar18;
  size_t __size;
  byte *pbVar19;
  uint uVar20;
  ulong uVar21;
  int local_44;
  
  __ptr = (XUtf8FontStruct *)malloc(0x38);
  if (__ptr == (XUtf8FontStruct *)0x0) {
    return (XUtf8FontStruct *)0x0;
  }
  iVar4 = 1;
  pcVar14 = base_font_name_list;
  do {
    if (*pcVar14 == ',') {
      iVar4 = iVar4 + 1;
    }
    else if (*pcVar14 == '\0') break;
    pcVar14 = pcVar14 + 1;
  } while( true );
  __ptr_00 = (char **)malloc((long)iVar4 << 3);
  __ptr->font_name_list = __ptr_00;
  uVar20 = 0;
  while (*base_font_name_list != '\0') {
    ppuVar5 = __ctype_b_loc();
    pcVar14 = base_font_name_list + -1;
    do {
      uVar7 = (ulong)(byte)pcVar14[1];
      pcVar14 = pcVar14 + 1;
    } while ((*(byte *)((long)*ppuVar5 + uVar7 * 2 + 1) & 0x20) != 0);
    lVar18 = 0;
    pcVar15 = pcVar14;
    __size = 2;
    while ((cVar3 = (char)uVar7, cVar3 != '\0' && ((int)uVar7 != 0x2c))) {
      pbVar16 = (byte *)(pcVar15 + 1);
      pcVar15 = pcVar15 + 1;
      __size = __size + 1;
      lVar18 = lVar18 + 1;
      uVar7 = (ulong)*pbVar16;
    }
    if (2 < (int)__size - 2U) {
      pcVar6 = (char *)malloc(__size);
      __ptr_00[(int)uVar20] = pcVar6;
      uVar7 = 0;
      for (; lVar18 != 0; lVar18 = lVar18 + -1) {
        __ptr_00[(int)uVar20][uVar7] = pcVar14[uVar7];
        uVar7 = uVar7 + 1;
      }
      __ptr_00[(int)uVar20][uVar7 & 0xffffffff] = '\0';
      uVar20 = uVar20 + 1;
      cVar3 = *pcVar15;
    }
    base_font_name_list = pcVar15 + (cVar3 != '\0');
  }
  if ((int)uVar20 < 1) {
    free(__ptr_00);
    free(__ptr);
    return (XUtf8FontStruct *)0x0;
  }
  __ptr->nb_font = uVar20;
  uVar7 = (ulong)uVar20;
  ppXVar8 = (XFontStruct **)malloc(uVar7 * 8);
  __ptr->fonts = ppXVar8;
  piVar9 = (int *)malloc(uVar7 * 8);
  __ptr->ranges = piVar9;
  __ptr->fid = 0;
  __ptr->ascent = 0;
  __ptr->descent = 0;
  iVar4 = 0;
  iVar13 = 0;
  for (uVar21 = 0; uVar7 != uVar21; uVar21 = uVar21 + 1) {
    puVar10 = (undefined8 *)XListFonts(dpy,__ptr_00[uVar21],1);
    if ((local_44 == 0) || (puVar10 == (undefined8 *)0x0)) {
      ppXVar8[uVar21] = (XFontStruct *)0x0;
LAB_001f4161:
      free(__ptr_00[uVar21]);
      __ptr_00[uVar21] = (char *)0x0;
    }
    else {
      free(__ptr_00[uVar21]);
      pcVar14 = strdup((char *)*puVar10);
      __ptr_00[uVar21] = pcVar14;
      pXVar11 = (XFontStruct *)XLoadQueryFont(dpy);
      XFreeFontNames(puVar10);
      ppXVar8[uVar21] = pXVar11;
      if (pXVar11 == (XFontStruct *)0x0) goto LAB_001f4161;
      __ptr->fid = pXVar11->fid;
      iVar2 = pXVar11->ascent;
      if (iVar13 < iVar2) {
        __ptr->ascent = iVar2;
        iVar13 = iVar2;
      }
      iVar2 = pXVar11->descent;
      if (iVar4 < iVar2) {
        __ptr->descent = iVar2;
        iVar4 = iVar2;
      }
    }
  }
  piVar12 = (int *)malloc(uVar7 * 4);
  uVar21 = 0;
LAB_001f418f:
  if (uVar21 == uVar7) {
    __ptr->encodings = piVar12;
    uVar21 = 0;
    uVar7 = (ulong)(uint)__ptr->nb_font;
    if (__ptr->nb_font < 1) {
      uVar7 = uVar21;
    }
    for (; uVar21 != uVar7; uVar21 = uVar21 + 1) {
      if (__ptr_00[uVar21] != (char *)0x0) {
        for (uVar17 = 0; uVar21 != uVar17; uVar17 = uVar17 + 1) {
          if ((((__ptr_00[uVar17] != (char *)0x0) && (piVar12[uVar17] == piVar12[uVar21])) &&
              (piVar9[uVar17 * 2] == piVar9[uVar21 * 2])) &&
             ((piVar9[uVar17 * 2 + 1] != 0 && (piVar9[uVar21 * 2 + 1] != 0)))) {
            XFreeFont(dpy,ppXVar8[uVar21]);
            free(__ptr_00[uVar21]);
            __ptr_00[uVar21] = (char *)0x0;
            ppXVar8[uVar21] = (XFontStruct *)0x0;
          }
        }
      }
    }
    return __ptr;
  }
  piVar12[uVar21] = -1;
  pcVar14 = __ptr_00[uVar21];
  (piVar9 + uVar21 * 2)[0] = 0;
  (piVar9 + uVar21 * 2)[1] = 0xffff;
  if (pcVar14 == (char *)0x0) {
    iVar4 = -1;
LAB_001f4210:
    pcVar14 = (char *)0x0;
  }
  else {
    pcVar15 = strstr(pcVar14,"fontspecific");
    if (pcVar15 != (char *)0x0) {
      pcVar15 = pcVar14 + -1;
      do {
        pcVar14 = pcVar14 + 1;
        pcVar6 = pcVar15 + 1;
        pcVar15 = pcVar15 + 1;
      } while (*pcVar6 != '-');
      do {
        cVar3 = *pcVar14;
        pcVar14 = pcVar14 + 1;
        pcVar15 = pcVar14;
      } while (cVar3 != '-');
      do {
        pcVar6 = pcVar15;
        pcVar15 = pcVar6 + 1;
      } while (*pcVar6 != '-');
      *pcVar6 = '\0';
      iVar4 = encoding_number(pcVar14);
      *pcVar6 = '-';
      piVar12[uVar21] = iVar4;
      goto LAB_001f4210;
    }
    iVar4 = -1;
  }
  iVar13 = 0;
  for (; pcVar14 != (char *)0x0; pcVar14 = pcVar14 + 1) {
    if (*pcVar14 == '-') {
      iVar13 = iVar13 + 1;
      if (iVar13 == 0xd) {
        pbVar16 = (byte *)(pcVar14 + 1);
        iVar4 = encoding_number((char *)pbVar16);
        piVar12[uVar21] = iVar4;
        if (iVar4 == 0) goto LAB_001f4265;
        break;
      }
    }
    else if (*pcVar14 == '\0') break;
  }
  if (iVar4 < 0) {
    piVar12[uVar21] = 1;
  }
  goto LAB_001f425d;
LAB_001f4265:
  bVar1 = *pbVar16;
  if (bVar1 == 0) goto LAB_001f425d;
  if (bVar1 == 0x2d) goto LAB_001f427c;
  pbVar16 = pbVar16 + 1;
  goto LAB_001f4265;
LAB_001f427c:
  while (bVar1 != 0) {
    if (bVar1 == 0x5b) {
      piVar9[uVar21 * 2] = 0xffff;
      lVar18 = 0;
      do {
        piVar9[uVar21 * 2 + 1] = (int)lVar18;
        do {
          if ((*pbVar16 == 0) || (*pbVar16 == 0x5d)) goto LAB_001f425d;
          pbVar19 = pbVar16 + 1;
          pbVar16 = pbVar19;
          while( true ) {
            uVar20 = *pbVar16 - 0x20;
            if (((uVar20 < 0x40) && ((0xa000000000000001U >> ((ulong)uVar20 & 0x3f) & 1) != 0)) ||
               (*pbVar16 == 0)) break;
            pbVar16 = pbVar16 + 1;
          }
          lVar18 = strtol((char *)pbVar19,(char **)0x0,0);
          iVar4 = (int)lVar18;
          if (iVar4 < piVar9[uVar21 * 2]) {
            piVar9[uVar21 * 2] = iVar4;
          }
        } while (iVar4 <= piVar9[uVar21 * 2 + 1]);
      } while( true );
    }
    pbVar19 = pbVar16 + 1;
    pbVar16 = pbVar16 + 1;
    bVar1 = *pbVar19;
  }
LAB_001f425d:
  uVar21 = uVar21 + 1;
  goto LAB_001f418f;
}

Assistant:

XUtf8FontStruct *
XCreateUtf8FontStruct(Display    *dpy,
		      const char *base_font_name_list) {

  XUtf8FontStruct *font_set;

  font_set = (XUtf8FontStruct*)malloc(sizeof(XUtf8FontStruct));

  if (!font_set) {
    return NULL;
  }

  font_set->nb_font = get_font_list(base_font_name_list,
				    &font_set->font_name_list);

  if (font_set->nb_font < 1) {
    free(font_set);
    return NULL;
  }

  load_fonts(dpy, font_set);

  return font_set;
}